

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.cc
# Opt level: O2

void __thiscall EmitPrettyPrint::~EmitPrettyPrint(EmitPrettyPrint *this)

{
  (this->super_EmitXml)._vptr_EmitXml = (_func_int **)&PTR__EmitPrettyPrint_003fce18;
  if (this->lowlevel != (EmitXml *)0x0) {
    (*this->lowlevel->_vptr_EmitXml[1])();
  }
  circularqueue<TokenSplit>::~circularqueue(&this->tokqueue);
  circularqueue<int>::~circularqueue(&this->scanqueue);
  std::__cxx11::string::~string((string *)&this->commentfill);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->indentstack).super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

EmitPrettyPrint::~EmitPrettyPrint(void)

{
  delete lowlevel;
}